

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

HighsStatus __thiscall
HighsSparseMatrix::assess
          (HighsSparseMatrix *this,HighsLogOptions *log_options,string *matrix_name,
          double small_matrix_value,double large_matrix_value)

{
  bool bVar1;
  HighsStatus HVar2;
  string *in_RDX;
  HighsSparseMatrix *in_RDI;
  bool partitioned;
  HighsInt num_vec;
  HighsInt vec_dim;
  bool in_stack_000000b7;
  HighsInt in_stack_000000b8;
  HighsInt in_stack_000000bc;
  string *in_stack_000000c0;
  HighsLogOptions *in_stack_000000c8;
  vector<int,_std::allocator<int>_> *in_stack_000000e0;
  vector<int,_std::allocator<int>_> *in_stack_000000e8;
  vector<double,_std::allocator<double>_> *in_stack_000000f0;
  string local_60 [39];
  undefined1 local_39;
  HighsInt local_38;
  HighsInt local_34;
  
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    local_34 = in_RDI->num_row_;
    local_38 = in_RDI->num_col_;
  }
  else {
    local_34 = in_RDI->num_col_;
    local_38 = in_RDI->num_row_;
  }
  local_39 = in_RDI->format_ == kRowwisePartitioned;
  std::__cxx11::string::string(local_60,in_RDX);
  HVar2 = assessMatrix(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,
                       in_stack_000000b7,(vector<int,_std::allocator<int>_> *)this,in_stack_000000e0
                       ,in_stack_000000e8,in_stack_000000f0,(double)log_options,(double)matrix_name)
  ;
  std::__cxx11::string::~string(local_60);
  return HVar2;
}

Assistant:

HighsStatus HighsSparseMatrix::assess(const HighsLogOptions& log_options,
                                      const std::string matrix_name,
                                      const double small_matrix_value,
                                      const double large_matrix_value) {
  assert(this->formatOk());
  // Identify main dimensions
  HighsInt vec_dim;
  HighsInt num_vec;
  if (this->isColwise()) {
    vec_dim = this->num_row_;
    num_vec = this->num_col_;
  } else {
    vec_dim = this->num_col_;
    num_vec = this->num_row_;
  }
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      this->start_, this->p_end_, this->index_, this->value_,
                      small_matrix_value, large_matrix_value);
}